

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::setup_shuffleColumn(HModel *this)

{
  value_type vVar1;
  int iVar2;
  reference pvVar3;
  reference __b;
  reference pvVar4;
  long in_RDI;
  int ifrom_1;
  int i_4;
  vector<double,_std::allocator<double>_> du_ColLowerImplied;
  vector<double,_std::allocator<double>_> du_ColUpperImplied;
  vector<double,_std::allocator<double>_> pr_ColUpperImplied;
  vector<double,_std::allocator<double>_> pr_ColLowerImplied;
  int k;
  int ifrom;
  int i_3;
  int countX;
  vector<double,_std::allocator<double>_> dxpert;
  vector<int,_std::allocator<int>_> ibreak;
  vector<double,_std::allocator<double>_> xcost;
  vector<double,_std::allocator<double>_> upper;
  vector<double,_std::allocator<double>_> lower;
  vector<double,_std::allocator<double>_> value;
  vector<int,_std::allocator<int>_> index;
  vector<int,_std::allocator<int>_> start;
  int j;
  int i_2;
  int i_1;
  vector<int,_std::allocator<int>_> iFrom;
  int i;
  HRandom localRandom;
  int in_stack_fffffffffffffdec;
  HModel *in_stack_fffffffffffffdf0;
  allocator_type *in_stack_fffffffffffffe00;
  size_type in_stack_fffffffffffffe08;
  value_type vVar5;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe38;
  value_type in_stack_fffffffffffffe3c;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe40;
  int local_184;
  vector<double,_std::allocator<double>_> local_180;
  vector<double,_std::allocator<double>_> local_168;
  vector<double,_std::allocator<double>_> local_150;
  vector<double,_std::allocator<double>_> local_138;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  vector<double,_std::allocator<double>_> local_110;
  vector<int,_std::allocator<int>_> local_f8;
  vector<double,_std::allocator<double>_> local_e0;
  vector<double,_std::allocator<double>_> local_c8;
  vector<double,_std::allocator<double>_> local_b0;
  vector<double,_std::allocator<double>_> local_98;
  vector<int,_std::allocator<int>_> local_80;
  vector<int,_std::allocator<int>_> local_68;
  int local_50;
  int local_4c;
  int local_48;
  vector<int,_std::allocator<int>_> local_30;
  int local_14;
  HRandom local_10 [2];
  
  if (*(int *)(in_RDI + 0x10) != 0) {
    HRandom::HRandom(local_10);
    for (local_14 = 0; local_14 < 10; local_14 = local_14 + 1) {
      HRandom::intRandom(local_10);
    }
    std::allocator<int>::allocator((allocator<int> *)0x17dd35);
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::allocator<int>::~allocator((allocator<int> *)0x17dd5e);
    for (local_48 = 0; iVar2 = local_48, local_48 < *(int *)(in_RDI + 0x60c);
        local_48 = local_48 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_48);
      *pvVar3 = iVar2;
    }
    local_4c = *(int *)(in_RDI + 0x60c);
    while (local_4c = local_4c + -1, 0 < local_4c) {
      local_50 = HRandom::intRandom(local_10);
      local_50 = local_50 % (local_4c + 1);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_4c);
      __b = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_50);
      std::swap<int>(pvVar3,__b);
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe40,
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe40,
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffe40,
               (vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffe40,
               (vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffe40,
               (vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffe40,
               (vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe40,
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffe40,
               (vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    local_114 = 0;
    for (local_118 = 0; local_118 < *(int *)(in_RDI + 0x60c); local_118 = local_118 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_118);
      iVar2 = local_114;
      local_11c = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)local_118);
      *pvVar3 = iVar2;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_68,(long)local_11c);
      for (local_120 = *pvVar3; iVar2 = local_120,
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&local_68,(long)(local_11c + 1)), iVar2 < *pvVar3;
          local_120 = local_120 + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,(long)local_120);
        in_stack_fffffffffffffe3c = *pvVar3;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),(long)local_114);
        *pvVar3 = in_stack_fffffffffffffe3c;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_98,(long)local_120)
        ;
        in_stack_fffffffffffffe40 = (vector<double,_std::allocator<double>_> *)*pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),
                            (long)local_114);
        *pvVar4 = (value_type)in_stack_fffffffffffffe40;
        local_114 = local_114 + 1;
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_b0,(long)local_11c);
      vVar5 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),
                          (long)local_118);
      *pvVar4 = vVar5;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_c8,(long)local_11c);
      vVar5 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),
                          (long)local_118);
      *pvVar4 = vVar5;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_e0,(long)local_11c);
      vVar5 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x690),
                          (long)local_118);
      *pvVar4 = vVar5;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_f8,(long)local_11c);
      vVar1 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x8a0),(long)local_118);
      *pvVar3 = vVar1;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_110,(long)local_11c);
      vVar5 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x8b8),
                          (long)local_118);
      *pvVar4 = vVar5;
    }
    if ((*(byte *)(in_RDI + 0x57c) & 1) != 0) {
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffe40,
                 (vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffe40,
                 (vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffe40,
                 (vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffe40,
                 (vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      for (local_184 = 0; local_184 < *(int *)(in_RDI + 0x60c); local_184 = local_184 + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_184);
        iVar2 = *pvVar3;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_138,(long)iVar2);
        in_stack_fffffffffffffdf0 = (HModel *)*pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1070),
                            (long)local_184);
        *pvVar4 = (value_type)in_stack_fffffffffffffdf0;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_150,(long)iVar2);
        vVar5 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1088),
                            (long)local_184);
        *pvVar4 = vVar5;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_168,(long)iVar2);
        in_stack_fffffffffffffe00 = (allocator_type *)*pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1118),
                            (long)local_184);
        *pvVar4 = (value_type)in_stack_fffffffffffffe00;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_180,(long)iVar2);
        vVar5 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1100),
                            (long)local_184);
        *pvVar4 = vVar5;
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00);
    }
    mlFg_Update(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe00);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe00);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe00);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe00);
  }
  return;
}

Assistant:

void HModel::setup_shuffleColumn() {
    if (intOption[INTOPT_PERMUTE_FLAG] == 0)
        return;

    // 1. Shuffle the column index
    HRandom localRandom;
    for (int i = 0; i < 10; i++)
        localRandom.intRandom();
    vector<int> iFrom(numCol);
    for (int i = 0; i < numCol; i++)
        iFrom[i] = i;
    for (int i = numCol - 1; i >= 1; i--) {
        int j = localRandom.intRandom() % (i + 1);
        swap(iFrom[i], iFrom[j]);
    }

    // 2. Save original copy
    vector<int> start = Astart;
    vector<int> index = Aindex;
    vector<double> value = Avalue;
    vector<double> lower = colLower;
    vector<double> upper = colUpper;
    vector<double> xcost = colCost;
    vector<int> ibreak = intBreak;
    vector<double> dxpert = dblXpert;

    // 3. Generate the permuted matrix
    int countX = 0;
    for (int i = 0; i < numCol; i++) {
        int ifrom = iFrom[i];
        Astart[i] = countX;
        for (int k = start[ifrom]; k < start[ifrom + 1]; k++) {
            Aindex[countX] = index[k];
            Avalue[countX] = value[k];
            countX++;
        }
        colLower[i] = lower[ifrom];
        colUpper[i] = upper[ifrom];
        colCost[i] = xcost[ifrom];
        intBreak[i] = ibreak[ifrom];
        dblXpert[i] = dxpert[ifrom];
    }
	if (impliedBoundsPresolve) {
		vector<double> pr_ColLowerImplied = primalColLowerImplied;
		vector<double> pr_ColUpperImplied = primalColUpperImplied;
		vector<double> du_ColUpperImplied = dualColUpperImplied;
		vector<double> du_ColLowerImplied = dualColLowerImplied;
		for (int i = 0; i < numCol; i++) {
			int ifrom = iFrom[i];
			primalColLowerImplied[i] = pr_ColLowerImplied[ifrom];
			primalColUpperImplied[i] = pr_ColUpperImplied[ifrom];
			dualColUpperImplied[i] = du_ColUpperImplied[ifrom];
			dualColLowerImplied[i] = du_ColLowerImplied[ifrom];
		}
	}
    assert(Astart[numCol] == countX);
    //Deduce the consequences of shuffling the LP
    mlFg_Update(mlFg_action_ShuffleLP);
}